

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_2046e7::releasePixels
               (int type,Array2D<unsigned_int_*> *uintData,Array2D<float_*> *floatData,
               Array2D<Imath_3_2::half_*> *halfData,int x1,int x2,int y1,int y2)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  if (y1 <= y2) {
    lVar2 = (long)y1;
    lVar3 = lVar2 * 8;
    do {
      lVar5 = (long)x1;
      iVar4 = (x2 - x1) + 1;
      if (x1 <= x2) {
        do {
          if (type == 2) {
            pvVar1 = *(void **)((long)halfData->_data + lVar5 * 8 + halfData->_sizeY * lVar3);
            if (pvVar1 != (void *)0x0) {
              operator_delete__(pvVar1);
            }
          }
          else if (type == 1) {
            pvVar1 = *(void **)((long)floatData->_data + lVar5 * 8 + floatData->_sizeY * lVar3);
            if (pvVar1 != (void *)0x0) {
              operator_delete__(pvVar1);
            }
          }
          else if ((type == 0) &&
                  (pvVar1 = *(void **)((long)uintData->_data + lVar5 * 8 + uintData->_sizeY * lVar3)
                  , pvVar1 != (void *)0x0)) {
            operator_delete__(pvVar1);
          }
          lVar5 = lVar5 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 8;
    } while (y2 + 1 != (int)lVar2);
  }
  return;
}

Assistant:

void
releasePixels (
    int                     type,
    Array2D<unsigned int*>& uintData,
    Array2D<float*>&        floatData,
    Array2D<half*>&         halfData,
    int                     x1,
    int                     x2,
    int                     y1,
    int                     y2)
{
    for (int y = y1; y <= y2; y++)
        for (int x = x1; x <= x2; x++)
        {
            if (type == 0) delete[] uintData[y][x];
            if (type == 1) delete[] floatData[y][x];
            if (type == 2) delete[] halfData[y][x];
        }
}